

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PPrintAttribute(TidyDocImpl *doc,uint indent,Node *node,AttVal *attr)

{
  int iVar1;
  int iVar2;
  TidyAttrId TVar3;
  byte bVar4;
  Bool BVar5;
  uint uVar6;
  Bool BVar7;
  Node *pNVar8;
  tmbstr value;
  tmbstr *pptVar9;
  byte *attrname;
  int iVar10;
  bool bVar11;
  tchar c;
  uint local_60;
  int local_5c;
  AttVal *local_58;
  Node *local_50;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  local_40 = (ulong)*(uint *)((doc->config).value + 100);
  local_38 = (ulong)*(uint *)((doc->config).value + 0x62);
  local_5c = *(int *)((doc->config).value + 0x5b);
  iVar1 = *(int *)((doc->config).value + 0x54);
  iVar2 = *(int *)((doc->config).value + 0x23);
  iVar10 = *(int *)((doc->config).value + 0x26);
  local_50 = node;
  if (node->element != (tmbstr)0x0) {
    pptVar9 = &node->element;
    BVar5 = prvTidynodeHasCM(node,0x10);
    if (BVar5 != no) {
      pNVar8 = node->parent;
      if (node->parent == (Node *)0x0) {
        pNVar8 = node;
      }
      BVar5 = ShouldIndent((TidyDocImpl *)(doc->config).value[0x25].p,pNVar8);
      node = local_50;
      if (BVar5 != no) {
        pNVar8 = prvTidyFindContainer(local_50);
        if (pNVar8 == (Node *)0x0) goto LAB_0014a8e0;
        pptVar9 = &pNVar8->element;
      }
    }
    uVar6 = prvTidytmbstrlen(*pptVar9);
    iVar10 = uVar6 + 2;
    node = local_50;
  }
LAB_0014a8e0:
  local_58 = node->attributes;
  attrname = (byte *)attr->attribute;
  if (iVar2 == 0) {
    local_44 = 0;
  }
  else {
    bVar11 = local_58 != attr;
    local_44 = iVar10;
    BVar5 = prvTidynodeIsElement(node);
    if (BVar5 != no && bVar11) {
      indent = iVar10 + indent;
      PCondFlushLineSmart(doc,indent);
    }
  }
  BVar5 = no;
  CheckWrapIndent(doc,indent);
  if ((local_38 == 0 && local_40 == 0) && (attr->dict != (Attribute *)0x0)) {
    BVar7 = prvTidyIsScript(doc,(ctmbstr)attrname);
    if (BVar7 == no) {
      if (attr->dict == (Attribute *)0x0) {
        if (local_5c != 0) goto LAB_0014abb1;
      }
      else {
        TVar3 = attr->dict->id;
        if ((((TVar3 != TidyAttr_ALT) && (TVar3 != TidyAttr_CONTENT)) && (TVar3 != TidyAttr_VALUE))
           && (TVar3 != TidyAttr_TITLE && local_5c != 0)) {
LAB_0014abb1:
          BVar5 = yes;
        }
      }
    }
    else {
      BVar5 = *(Bool *)((doc->config).value + 0x5f);
    }
  }
  uVar6 = (doc->pprint).linelen;
  if (local_58 != attr) {
    if ((doc->config).value[0x5d].v <= (ulong)(indent + uVar6)) {
      if ((doc->pprint).ixInd == 0) {
        (doc->pprint).indent[1].spaces = indent;
        (doc->pprint).ixInd = 1;
      }
      prvTidyPFlushLine(doc,local_44 + indent);
      goto LAB_0014aa00;
    }
    if ((doc->pprint).indent[0].spaces < 0) {
      (doc->pprint).indent[0].spaces = indent;
    }
    (doc->pprint).wraphere = uVar6;
  }
  if (uVar6 != 0) {
    AddChar(&doc->pprint,0x20);
  }
LAB_0014aa00:
  bVar4 = *attrname;
  if (bVar4 != 0) {
    do {
      local_60 = (uint)bVar4;
      if ((char)bVar4 < '\0') {
        uVar6 = prvTidyGetUTF8((ctmbstr)attrname,&local_60);
        attrname = attrname + uVar6;
      }
      else if (iVar1 == 1) {
        local_60 = prvTidyToUpper(local_60);
      }
      AddChar(&doc->pprint,local_60);
      bVar4 = attrname[1];
      attrname = attrname + 1;
    } while (bVar4 != 0);
  }
  CheckWrapIndent(doc,indent);
  value = attr->value;
  if (value == (tmbstr)0x0) {
    BVar5 = prvTidyIsBoolAttribute(attr);
    BVar7 = prvTidyattrIsEvent(attr);
    if (local_40 == 0) {
      if ((BVar5 != no) || (BVar5 = prvTidyIsNewNode(local_50), BVar5 != no)) {
        uVar6 = (doc->pprint).linelen;
        if ((ulong)(indent + uVar6) < (doc->config).value[0x5d].v) {
          if ((doc->pprint).indent[0].spaces < 0) {
            (doc->pprint).indent[0].spaces = indent;
          }
          (doc->pprint).wraphere = uVar6;
          return;
        }
        if ((doc->pprint).ixInd != 0) {
          return;
        }
        (doc->pprint).indent[1].spaces = indent;
        (doc->pprint).ixInd = 1;
        return;
      }
      uVar6 = attr->delim;
      value = "";
      BVar5 = yes;
    }
    else {
      if (BVar5 == no) {
        value = "";
      }
      else {
        value = attr->attribute;
      }
      uVar6 = attr->delim;
      BVar5 = no;
    }
  }
  else {
    uVar6 = attr->delim;
    BVar7 = no;
  }
  PPrintAttrValue(doc,indent,value,uVar6,BVar5,BVar7);
  return;
}

Assistant:

static void PPrintAttribute( TidyDocImpl* doc, uint indent,
                             Node *node, AttVal *attr )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool xmlOut    = cfgBool( doc, TidyXmlOut );
    Bool xhtmlOut  = cfgBool( doc, TidyXhtmlOut );
    Bool wrapAttrs = cfgBool( doc, TidyWrapAttVals );
    uint ucAttrs   = cfg( doc, TidyUpperCaseAttrs );
    Bool indAttrs  = cfgBool( doc, TidyIndentAttributes );
    uint xtra      = AttrIndent( doc, node, attr );
    Bool first     = (attr == node->attributes);
    tmbstr name    = attr->attribute;
    Bool wrappable = no;
    tchar c;

    /* fix for odd attribute indentation bug triggered by long values */
    if (!indAttrs)
      xtra = 0;

    if ( indAttrs )
    {
        if ( TY_(nodeIsElement)(node) && !first )
        {
            indent += xtra;
            PCondFlushLineSmart( doc, indent );
        }
    }

    CheckWrapIndent( doc, indent );

    if ( !xmlOut && !xhtmlOut && attr->dict )
    {
        if ( TY_(IsScript)(doc, name) )
            wrappable = cfgBool( doc, TidyWrapScriptlets );
        else if (!(attrIsCONTENT(attr) || attrIsVALUE(attr) || attrIsALT(attr) || attrIsTITLE(attr)) && wrapAttrs )
            wrappable = yes;
    }

    if ( !first && !SetWrap(doc, indent) )
    {
        TY_(PFlushLine)( doc, indent+xtra );  /* Put it on next line */
    }
    else if ( pprint->linelen > 0 )
    {
        AddChar( pprint, ' ' );
    }

    /* Attribute name */
    while (*name)
    {
        c = (unsigned char)*name;

        if (c > 0x7F)
            name += TY_(GetUTF8)(name, &c);
        else if (ucAttrs == TidyUppercaseYes)
            c = TY_(ToUpper)(c);

        AddChar(pprint, c);
        ++name;
    }

    CheckWrapIndent( doc, indent );
 
    if ( attr->value == NULL )
    {
        Bool isB = TY_(IsBoolAttribute)(attr);
        Bool scriptAttr = TY_(attrIsEvent)(attr);

        if ( xmlOut )
            PPrintAttrValue( doc, indent, isB ? attr->attribute : NULLSTR,
                             attr->delim, no, scriptAttr );

        else if ( !isB && !TY_(IsNewNode)(node) )
            PPrintAttrValue( doc, indent, "", attr->delim, yes, scriptAttr );

        else 
            SetWrap( doc, indent );
    }
    else
        PPrintAttrValue( doc, indent, attr->value, attr->delim, wrappable, no );
}